

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf_pyr_height_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a9f5c8::GFPyrHeightTest_EncodeAndVerifyPSNR_Test::TestBody
          (GFPyrHeightTest_EncodeAndVerifyPSNR_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  Message *pMVar2;
  Message *pMVar3;
  char *message;
  GFPyrHeightTest *in_RDI;
  AssertHelper *this_01;
  AssertionResult gtest_ar;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe94;
  double *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  int iVar6;
  char *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  Type TVar7;
  HasNewFatalFailureHelper *in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed8;
  Message *in_stack_ffffffffffffff08;
  AssertHelper *in_stack_ffffffffffffff10;
  AssertionResult local_e0 [2];
  int local_bc;
  HasNewFatalFailureHelper local_b8;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [104];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"hantro_collage_w352h288.yuv",&local_89);
  uVar5 = 0x20;
  uVar4 = 0;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
             (uint)((ulong)in_stack_fffffffffffffeb0 >> 0x20),(uint)in_stack_fffffffffffffeb0,
             (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(int)in_stack_fffffffffffffea8,
             in_stack_fffffffffffffed0,in_stack_fffffffffffffed8);
  TVar7 = (Type)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_stack_fffffffffffffec0)
    ;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(in_RDI->super_EncoderTest)._vptr_EncoderTest[2])(&in_RDI->super_EncoderTest,local_68);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_b8);
    if (bVar1) {
      local_bc = 2;
    }
    else {
      local_bc = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffe94,uVar5));
    if (local_bc == 0) {
      GFPyrHeightTest::GetAveragePsnr(in_RDI);
      this_01 = (AssertHelper *)GFPyrHeightTest::GetPsnrThreshold(in_RDI);
      testing::internal::CmpHelperGT<double,double>
                (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 (double *)CONCAT44(in_stack_fffffffffffffe94,uVar5));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffec0);
        testing::Message::operator<<
                  ((Message *)CONCAT44(in_stack_fffffffffffffe94,uVar5),
                   (char (*) [25])CONCAT44(in_stack_fffffffffffffe8c,uVar4));
        this_00 = (AssertHelper *)
                  testing::Message::operator<<
                            ((Message *)CONCAT44(in_stack_fffffffffffffe94,uVar5),
                             (int *)CONCAT44(in_stack_fffffffffffffe8c,uVar4));
        pMVar2 = testing::Message::operator<<
                           ((Message *)CONCAT44(in_stack_fffffffffffffe94,uVar5),
                            (char (*) [3])CONCAT44(in_stack_fffffffffffffe8c,uVar4));
        TVar7 = (Type)((ulong)pMVar2 >> 0x20);
        pMVar2 = testing::Message::operator<<
                           ((Message *)CONCAT44(in_stack_fffffffffffffe94,uVar5),
                            (char (*) [25])CONCAT44(in_stack_fffffffffffffe8c,uVar4));
        pMVar3 = testing::Message::operator<<
                           ((Message *)CONCAT44(in_stack_fffffffffffffe94,uVar5),
                            (int *)CONCAT44(in_stack_fffffffffffffe8c,uVar4));
        iVar6 = (int)((ulong)pMVar3 >> 0x20);
        message = testing::AssertionResult::failure_message((AssertionResult *)0x837f82);
        testing::internal::AssertHelper::AssertHelper(this_00,TVar7,(char *)pMVar2,iVar6,message);
        testing::internal::AssertHelper::operator=(this_01,in_stack_ffffffffffffff08);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe94,uVar5));
        testing::Message::~Message((Message *)0x837fd3);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x838025);
      local_bc = 0;
      goto LAB_00838030;
    }
    if (local_bc != 2) goto LAB_00838030;
  }
  iVar6 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  testing::Message::Message((Message *)in_stack_fffffffffffffec0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffec0,TVar7,in_stack_fffffffffffffeb0,iVar6,
             in_stack_fffffffffffffea0);
  testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe94,uVar5));
  testing::Message::~Message((Message *)0x837dde);
  local_bc = 1;
LAB_00838030:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x83803d);
  return;
}

Assistant:

TEST_P(GFPyrHeightTest, EncodeAndVerifyPSNR) {
  libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                     cfg_.g_timebase.den, cfg_.g_timebase.num,
                                     0, 32);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  EXPECT_GT(GetAveragePsnr(), GetPsnrThreshold())
      << "GF Min Pyramid Height = " << gf_min_pyr_height_ << ", "
      << "GF Max Pyramid Height = " << gf_max_pyr_height_;
}